

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O0

void __thiscall adios2::profiling::IOChrono::Start(IOChrono *this,string *process)

{
  long in_RDI;
  key_type *in_stack_fffffffffffffec8;
  Timer *in_stack_fffffffffffffed0;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) != 0) {
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
    ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::profiling::Timer>_>_>
          *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    Timer::Resume(in_stack_fffffffffffffed0);
  }
  return;
}

Assistant:

void IOChrono::Start(const std::string process) noexcept
{
    if (m_IsActive)
    {
        try
        {
            m_Timers.at(process).Resume();
        }
        catch (...)
        {
            std::cout << "Adding timer \"" << process << "\" didn't exist." << std::endl;
            m_Timers.emplace(process, profiling::Timer(process, DefaultTimeUnitEnum, false));
            m_Timers.at(process).Resume();
        }
    }
}